

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void checkPropertyConsistency<bool>
               (cmTarget *depender,cmTarget *dependee,string *propName,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emitted,string *config,CompatibleType t,bool *param_7)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  long *plVar6;
  ostream *poVar7;
  long *plVar8;
  pointer __v;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string pname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string pdir;
  ostringstream e;
  long *local_288;
  long local_278;
  long lStack_270;
  string *local_268;
  cmTarget *local_260;
  string local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  cmTarget *local_218;
  string *local_210;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_268 = propName;
  local_260 = depender;
  local_210 = config;
  pcVar4 = cmTarget::GetProperty(dependee,propName,dependee->Makefile);
  if (pcVar4 != (char *)0x0) {
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8._0_8_ = local_1a8 + 0x10;
    sVar5 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar4,pcVar4 + sVar5);
    cmSystemTools::ExpandListArgument((string *)local_1a8,&local_238,false);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    pcVar1 = dependee->Makefile;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_ROOT","");
    pcVar4 = cmMakefile::GetRequiredDefinition(pcVar1,(string *)local_1a8);
    std::__cxx11::string::string((string *)&local_1e8,pcVar4,(allocator *)&local_258);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_218 = dependee;
    std::__cxx11::string::append((char *)&local_1e8);
    if (local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __v = local_238.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar2 = (__v->_M_dataplus)._M_p;
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,pcVar2,pcVar2 + __v->_M_string_length);
        cmSystemTools::HelpFileName(&local_258,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,&local_1e8,&local_258);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_1a8);
        local_288 = &local_278;
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_278 = *plVar8;
          lStack_270 = plVar6[3];
        }
        else {
          local_278 = *plVar8;
          local_288 = (long *)*plVar6;
        }
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        bVar3 = cmsys::SystemTools::FileExists((char *)local_288,true);
        if (bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(local_218->Name)._M_dataplus._M_p,
                              (local_218->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" has property \"",0x10);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(__v->_M_dataplus)._M_p,__v->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" listed in its ",0x10);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(local_268->_M_dataplus)._M_p,local_268->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     " property.  This is not allowed.  Only user-defined properties may appear listed in the "
                     ,0x58);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(local_268->_M_dataplus)._M_p,local_268->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," property.",10);
          pcVar1 = local_260->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
LAB_0032008e:
          if (local_288 != &local_278) {
            operator_delete(local_288,local_278 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        pVar9 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)emitted,__v);
        if ((((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
           (((checkInterfacePropertyCompatibility<bool>
                        (local_260,__v,local_210,"FALSE",BoolType,(bool *)0x0),
             cmSystemTools::s_ErrorOccured != false || (cmSystemTools::s_FatalErrorOccured != false)
             ) || (bVar3 = cmSystemTools::GetInterruptFlag(), bVar3)))) goto LAB_0032008e;
        if (local_288 != &local_278) {
          operator_delete(local_288,local_278 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        __v = __v + 1;
      } while (__v != local_238.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_238);
  }
  return;
}

Assistant:

void checkPropertyConsistency(cmTarget const* depender,
                              cmTarget const* dependee,
                              const std::string& propName,
                              std::set<std::string> &emitted,
                              const std::string& config,
                              CompatibleType t,
                              PropertyType *)
{
  const char *prop = dependee->GetProperty(propName);
  if (!prop)
    {
    return;
    }

  std::vector<std::string> props;
  cmSystemTools::ExpandListArgument(prop, props);
  std::string pdir =
    dependee->GetMakefile()->GetRequiredDefinition("CMAKE_ROOT");
  pdir += "/Help/prop_tgt/";

  for(std::vector<std::string>::iterator pi = props.begin();
      pi != props.end(); ++pi)
    {
    std::string pname = cmSystemTools::HelpFileName(*pi);
    std::string pfile = pdir + pname + ".rst";
    if(cmSystemTools::FileExists(pfile.c_str(), true))
      {
      std::ostringstream e;
      e << "Target \"" << dependee->GetName() << "\" has property \""
        << *pi << "\" listed in its " << propName << " property.  "
          "This is not allowed.  Only user-defined properties may appear "
          "listed in the " << propName << " property.";
      depender->GetMakefile()->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    if(emitted.insert(*pi).second)
      {
      getLinkInterfaceDependentProperty<PropertyType>(depender, *pi, config,
                                                      t, 0);
      if (cmSystemTools::GetErrorOccuredFlag())
        {
        return;
        }
      }
    }
}